

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

int16_t __thiscall wasm::Random::get16(Random *this)

{
  byte bVar1;
  int8_t iVar2;
  
  bVar1 = get(this);
  iVar2 = get(this);
  return (short)iVar2 | (ushort)bVar1 << 8;
}

Assistant:

int16_t Random::get16() {
  auto temp = uint16_t(get()) << 8;
  return temp | uint16_t(get());
}